

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O3

void __thiscall cppnet::RWSocket::Close(RWSocket *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Dispatcher *this_01;
  _Atomic_word _Var2;
  bool bVar3;
  
  (*(this->super_Socket)._vptr_Socket[10])();
  if (this->_timer_id != 0) {
    this_00 = (this->super_Socket)._dispatcher.
              super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var2 = this_00->_M_use_count;
      while (_Var2 != 0) {
        LOCK();
        iVar1 = this_00->_M_use_count;
        bVar3 = _Var2 == iVar1;
        if (bVar3) {
          this_00->_M_use_count = _Var2 + 1;
          iVar1 = _Var2;
        }
        _Var2 = iVar1;
        UNLOCK();
        if (bVar3) {
          this_01 = (this->super_Socket)._dispatcher.
                    super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (this_01 != (Dispatcher *)0x0 && this_00->_M_use_count != 0) {
            Dispatcher::StopTimer(this_01,this->_timer_id);
          }
          this->_timer_id = 0;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          return;
        }
      }
    }
    this->_timer_id = 0;
  }
  return;
}

Assistant:

void RWSocket::Close() {
    Disconnect();
    if (_timer_id > 0) {
        auto dispatcher = GetDispatcher();
        if (dispatcher) {
            dispatcher->StopTimer(_timer_id);
        }
        _timer_id = 0;
    }
}